

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeGetContent(xmlNode *cur)

{
  xmlEntityPtr pxVar1;
  xmlBufPtr pxVar2;
  xmlChar *tmp;
  xmlChar *ret_2;
  xmlBufPtr buf_2;
  xmlChar *ret_1;
  xmlBufPtr buf_1;
  xmlEntityPtr ent;
  xmlChar *ret;
  xmlBufPtr buf;
  xmlNode *cur_local;
  
  if (cur == (xmlNode *)0x0) {
    cur_local = (xmlNode *)0x0;
  }
  else {
    switch(cur->type) {
    case XML_ELEMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
      pxVar2 = xmlBufCreateSize(0x40);
      if (pxVar2 == (xmlBufPtr)0x0) {
        cur_local = (xmlNode *)0x0;
      }
      else {
        xmlBufSetAllocationScheme(pxVar2,XML_BUFFER_ALLOC_DOUBLEIT);
        xmlBufGetNodeContent(pxVar2,cur);
        cur_local = (xmlNode *)xmlBufDetach(pxVar2);
        xmlBufFree(pxVar2);
      }
      break;
    case XML_ATTRIBUTE_NODE:
      cur_local = (xmlNode *)xmlGetPropNodeValueInternal((xmlAttr *)cur);
      break;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
      if (cur->content == (xmlChar *)0x0) {
        cur_local = (xmlNode *)0x0;
      }
      else {
        cur_local = (xmlNode *)xmlStrdup(cur->content);
      }
      break;
    case XML_ENTITY_REF_NODE:
      pxVar1 = xmlGetDocEntity(cur->doc,cur->name);
      if (pxVar1 == (xmlEntityPtr)0x0) {
        cur_local = (xmlNode *)0x0;
      }
      else {
        pxVar2 = xmlBufCreate();
        if (pxVar2 == (xmlBufPtr)0x0) {
          cur_local = (xmlNode *)0x0;
        }
        else {
          xmlBufSetAllocationScheme(pxVar2,XML_BUFFER_ALLOC_DOUBLEIT);
          xmlBufGetNodeContent(pxVar2,cur);
          cur_local = (xmlNode *)xmlBufDetach(pxVar2);
          xmlBufFree(pxVar2);
        }
      }
      break;
    case XML_ENTITY_NODE:
    case XML_DOCUMENT_TYPE_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      cur_local = (xmlNode *)0x0;
      break;
    case XML_PI_NODE:
    case XML_COMMENT_NODE:
      if (cur->content == (xmlChar *)0x0) {
        cur_local = (xmlNode *)0x0;
      }
      else {
        cur_local = (xmlNode *)xmlStrdup(cur->content);
      }
      break;
    case XML_DOCUMENT_NODE:
    case XML_HTML_DOCUMENT_NODE:
      pxVar2 = xmlBufCreate();
      if (pxVar2 == (xmlBufPtr)0x0) {
        cur_local = (xmlNode *)0x0;
      }
      else {
        xmlBufSetAllocationScheme(pxVar2,XML_BUFFER_ALLOC_DOUBLEIT);
        xmlBufGetNodeContent(pxVar2,cur);
        cur_local = (xmlNode *)xmlBufDetach(pxVar2);
        xmlBufFree(pxVar2);
      }
      break;
    case XML_ELEMENT_DECL:
      cur_local = (xmlNode *)0x0;
      break;
    case XML_ATTRIBUTE_DECL:
      cur_local = (xmlNode *)0x0;
      break;
    case XML_ENTITY_DECL:
      cur_local = (xmlNode *)0x0;
      break;
    case XML_NAMESPACE_DECL:
      cur_local = (xmlNode *)xmlStrdup(cur->name);
      break;
    default:
      cur_local = (xmlNode *)0x0;
    }
  }
  return (xmlChar *)cur_local;
}

Assistant:

xmlChar *
xmlNodeGetContent(const xmlNode *cur)
{
    if (cur == NULL)
        return (NULL);
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:{
                xmlBufPtr buf;
                xmlChar *ret;

                buf = xmlBufCreateSize(64);
                if (buf == NULL)
                    return (NULL);
                xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);
		xmlBufGetNodeContent(buf, cur);
                ret = xmlBufDetach(buf);
                xmlBufFree(buf);
                return (ret);
            }
        case XML_ATTRIBUTE_NODE:
	    return(xmlGetPropNodeValueInternal((xmlAttrPtr) cur));
        case XML_COMMENT_NODE:
        case XML_PI_NODE:
            if (cur->content != NULL)
                return (xmlStrdup(cur->content));
            return (NULL);
        case XML_ENTITY_REF_NODE:{
                xmlEntityPtr ent;
                xmlBufPtr buf;
                xmlChar *ret;

                /* lookup entity declaration */
                ent = xmlGetDocEntity(cur->doc, cur->name);
                if (ent == NULL)
                    return (NULL);

                buf = xmlBufCreate();
                if (buf == NULL)
                    return (NULL);
                xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

                xmlBufGetNodeContent(buf, cur);

                ret = xmlBufDetach(buf);
                xmlBufFree(buf);
                return (ret);
            }
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            return (NULL);
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE: {
	    xmlBufPtr buf;
	    xmlChar *ret;

	    buf = xmlBufCreate();
	    if (buf == NULL)
		return (NULL);
            xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

	    xmlBufGetNodeContent(buf, (xmlNodePtr) cur);

	    ret = xmlBufDetach(buf);
	    xmlBufFree(buf);
	    return (ret);
	}
        case XML_NAMESPACE_DECL: {
	    xmlChar *tmp;

	    tmp = xmlStrdup(((xmlNsPtr) cur)->href);
            return (tmp);
	}
        case XML_ELEMENT_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_ATTRIBUTE_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_ENTITY_DECL:
            /* TODO !!! */
            return (NULL);
        case XML_CDATA_SECTION_NODE:
        case XML_TEXT_NODE:
            if (cur->content != NULL)
                return (xmlStrdup(cur->content));
            return (NULL);
    }
    return (NULL);
}